

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O1

Zp_field_element<2U,_unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::get_inverse
          (Zp_field_element<2U,_unsigned_int,_void> *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint *in_RDI;
  int iVar8;
  int iVar9;
  
  uVar3 = this->element_;
  uVar5 = (ulong)uVar3;
  if ((uVar5 != 0) && (inverse_._M_elems[uVar5] == 0)) {
    iVar8 = 1;
    if (1 < (int)uVar3) {
      uVar6 = 2;
      iVar2 = 0;
      iVar9 = 1;
      do {
        iVar8 = iVar2;
        uVar4 = uVar3 / uVar6;
        uVar7 = uVar3 % uVar6;
        bVar1 = 1 < uVar6;
        uVar3 = uVar6;
        uVar6 = uVar7;
        iVar2 = iVar9 - uVar4 * iVar8;
        iVar9 = iVar8;
      } while (bVar1);
    }
    inverse_._M_elems[uVar5] = iVar8 + (iVar8 >> 0x1f) * -2;
  }
  *in_RDI = inverse_._M_elems[this->element_] & 1;
  return (Zp_field_element<2U,_unsigned_int,_void>)(Element_conflict)in_RDI;
}

Assistant:

Zp_field_element get_inverse() const {
    if (element_ != 0 && inverse_[element_] == 0) {  // initialize everything at instantiation instead?
      inverse_[element_] = _get_inverse(element_);
    }

    return Zp_field_element<characteristic>(inverse_[element_]);
  }